

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cipher.cc
# Opt level: O0

void bssl::ssl_cipher_apply_rule
               (uint32_t cipher_id,CIPHER_ALIAS *alias,int rule,int strength_bits,bool in_group,
               CIPHER_ORDER **head_p,CIPHER_ORDER **tail_p)

{
  SSL_CIPHER *cipher;
  CIPHER_ORDER *curr_00;
  int iVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  cipher_order_st *local_70;
  bool reverse;
  SSL_CIPHER *cp;
  CIPHER_ORDER *last;
  CIPHER_ORDER *next;
  CIPHER_ORDER *curr;
  CIPHER_ORDER *tail;
  CIPHER_ORDER *head;
  CIPHER_ORDER **head_p_local;
  int local_20;
  int iStack_1c;
  bool in_group_local;
  int strength_bits_local;
  int rule_local;
  CIPHER_ALIAS *alias_local;
  uint32_t cipher_id_local;
  
  if ((((cipher_id != 0) || (strength_bits != -1)) || (alias->min_version != 0)) ||
     (((alias->algorithm_mkey != 0 && (alias->algorithm_auth != 0)) &&
      ((alias->algorithm_enc != 0 && (alias->algorithm_mac != 0)))))) {
    tail = *head_p;
    curr = *tail_p;
    cp = (SSL_CIPHER *)curr;
    last = tail;
    if (rule == 3) {
      cp = (SSL_CIPHER *)tail;
      last = curr;
    }
    next = (CIPHER_ORDER *)0x0;
    head = (CIPHER_ORDER *)head_p;
    head_p_local._7_1_ = in_group;
    local_20 = strength_bits;
    iStack_1c = rule;
    _strength_bits_local = alias;
    alias_local._4_4_ = cipher_id;
LAB_001a0abf:
    while (iVar1 = local_20, curr_00 = last, (SSL_CIPHER *)next != cp) {
      next = last;
      if (last == (CIPHER_ORDER *)0x0) break;
      if (rule != 3) {
        local_70 = last->next;
      }
      else {
        local_70 = last->prev;
      }
      last = local_70;
      cipher = curr_00->cipher;
      if (alias_local._4_4_ == 0) {
        if (local_20 < 0) goto LAB_001a0b5a;
        iVar4 = SSL_CIPHER_get_bits(cipher,(int *)0x0);
        if (iVar1 == iVar4) goto LAB_001a0bed;
      }
      else if (alias_local._4_4_ == cipher->id) goto LAB_001a0bed;
    }
    head->cipher = (SSL_CIPHER *)tail;
    *tail_p = curr;
  }
  return;
LAB_001a0b5a:
  if ((((((_strength_bits_local->algorithm_mkey & cipher->algorithm_mkey) != 0) &&
        ((_strength_bits_local->algorithm_auth & cipher->algorithm_auth) != 0)) &&
       (((_strength_bits_local->algorithm_enc & cipher->algorithm_enc) != 0 &&
        ((_strength_bits_local->algorithm_mac & cipher->algorithm_mac) != 0)))) &&
      ((_strength_bits_local->min_version == 0 ||
       (uVar3 = SSL_CIPHER_get_min_version(cipher), uVar3 == _strength_bits_local->min_version))))
     && (((_strength_bits_local->include_deprecated & 1U) != 0 ||
         (bVar2 = ssl_cipher_is_deprecated(cipher), !bVar2)))) {
LAB_001a0bed:
    if (iStack_1c == 1) {
      if ((curr_00->active & 1U) == 0) {
        ll_append_tail(&tail,curr_00,&curr);
        curr_00->active = true;
        curr_00->in_group = (bool)(head_p_local._7_1_ & 1);
      }
    }
    else if (iStack_1c == 4) {
      if ((curr_00->active & 1U) != 0) {
        ll_append_tail(&tail,curr_00,&curr);
        curr_00->in_group = false;
      }
    }
    else if (iStack_1c == 3) {
      if ((curr_00->active & 1U) != 0) {
        ll_append_head(&tail,curr_00,&curr);
        curr_00->active = false;
        curr_00->in_group = false;
      }
    }
    else if (iStack_1c == 2) {
      if (tail == curr_00) {
        tail = curr_00->next;
      }
      else {
        curr_00->prev->next = curr_00->next;
      }
      if (curr == curr_00) {
        curr = curr_00->prev;
      }
      curr_00->active = false;
      if (curr_00->next != (cipher_order_st *)0x0) {
        curr_00->next->prev = curr_00->prev;
      }
      if (curr_00->prev != (cipher_order_st *)0x0) {
        curr_00->prev->next = curr_00->next;
      }
      curr_00->next = (cipher_order_st *)0x0;
      curr_00->prev = (cipher_order_st *)0x0;
    }
  }
  goto LAB_001a0abf;
}

Assistant:

static void ssl_cipher_apply_rule(uint32_t cipher_id, const CIPHER_ALIAS *alias,
                                  int rule, int strength_bits, bool in_group,
                                  CIPHER_ORDER **head_p,
                                  CIPHER_ORDER **tail_p) {
  CIPHER_ORDER *head, *tail, *curr, *next, *last;
  const SSL_CIPHER *cp;
  bool reverse = false;

  if (cipher_id == 0 && strength_bits == -1 && alias->min_version == 0 &&
      (alias->algorithm_mkey == 0 || alias->algorithm_auth == 0 ||
       alias->algorithm_enc == 0 || alias->algorithm_mac == 0)) {
    // The rule matches nothing, so bail early.
    return;
  }

  if (rule == CIPHER_DEL) {
    // needed to maintain sorting between currently deleted ciphers
    reverse = true;
  }

  head = *head_p;
  tail = *tail_p;

  if (reverse) {
    next = tail;
    last = head;
  } else {
    next = head;
    last = tail;
  }

  curr = NULL;
  for (;;) {
    if (curr == last) {
      break;
    }

    curr = next;
    if (curr == NULL) {
      break;
    }

    next = reverse ? curr->prev : curr->next;
    cp = curr->cipher;

    // Selection criteria is either a specific cipher, the value of
    // |strength_bits|, or the algorithms used.
    if (cipher_id != 0) {
      if (cipher_id != cp->id) {
        continue;
      }
    } else if (strength_bits >= 0) {
      if (strength_bits != SSL_CIPHER_get_bits(cp, NULL)) {
        continue;
      }
    } else {
      if (!(alias->algorithm_mkey & cp->algorithm_mkey) ||
          !(alias->algorithm_auth & cp->algorithm_auth) ||
          !(alias->algorithm_enc & cp->algorithm_enc) ||
          !(alias->algorithm_mac & cp->algorithm_mac) ||
          (alias->min_version != 0 &&
           SSL_CIPHER_get_min_version(cp) != alias->min_version) ||
          (!alias->include_deprecated && ssl_cipher_is_deprecated(cp))) {
        continue;
      }
    }

    // add the cipher if it has not been added yet.
    if (rule == CIPHER_ADD) {
      // reverse == false
      if (!curr->active) {
        ll_append_tail(&head, curr, &tail);
        curr->active = true;
        curr->in_group = in_group;
      }
    }

    // Move the added cipher to this location
    else if (rule == CIPHER_ORD) {
      // reverse == false
      if (curr->active) {
        ll_append_tail(&head, curr, &tail);
        curr->in_group = false;
      }
    } else if (rule == CIPHER_DEL) {
      // reverse == true
      if (curr->active) {
        // most recently deleted ciphersuites get best positions
        // for any future CIPHER_ADD (note that the CIPHER_DEL loop
        // works in reverse to maintain the order)
        ll_append_head(&head, curr, &tail);
        curr->active = false;
        curr->in_group = false;
      }
    } else if (rule == CIPHER_KILL) {
      // reverse == false
      if (head == curr) {
        head = curr->next;
      } else {
        curr->prev->next = curr->next;
      }

      if (tail == curr) {
        tail = curr->prev;
      }
      curr->active = false;
      if (curr->next != NULL) {
        curr->next->prev = curr->prev;
      }
      if (curr->prev != NULL) {
        curr->prev->next = curr->next;
      }
      curr->next = NULL;
      curr->prev = NULL;
    }
  }

  *head_p = head;
  *tail_p = tail;
}